

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

void __thiscall smf::MidiFile::makeDeltaTicks(MidiFile *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  MidiEvent *pMVar5;
  ostream *poVar6;
  int iVar7;
  ulong uVar8;
  
  if (this->m_theTimeState != 0) {
    uVar3 = (ulong)((long)(this->m_events).
                          super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_events).
                         super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar8 = 0;
    uVar4 = uVar3 & 0xffffffff;
    if ((int)uVar3 < 1) {
      uVar4 = uVar8;
    }
    for (; uVar8 != uVar4; uVar8 = uVar8 + 1) {
      iVar1 = MidiEventList::size((this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar8]);
      if (0 < iVar1) {
        pMVar5 = MidiEventList::operator[]
                           ((this->m_events).
                            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar8],0);
        iVar7 = pMVar5->tick;
        for (iVar1 = 1;
            iVar2 = MidiEventList::size((this->m_events).
                                        super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar8]),
            iVar1 < iVar2; iVar1 = iVar1 + 1) {
          pMVar5 = MidiEventList::operator[]
                             ((this->m_events).
                              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar8],iVar1);
          iVar2 = pMVar5->tick;
          iVar7 = iVar2 - iVar7;
          if (iVar7 < 0) {
            poVar6 = std::operator<<((ostream *)&std::cerr,"Error: negative delta tick value: ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar7);
            poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
            poVar6 = std::operator<<(poVar6,"Timestamps must be sorted first");
            poVar6 = std::operator<<(poVar6," (use MidiFile::sortTracks() before writing).");
            std::endl<char,std::char_traits<char>>(poVar6);
          }
          pMVar5 = MidiEventList::operator[]
                             ((this->m_events).
                              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar8],iVar1);
          pMVar5->tick = iVar7;
          iVar7 = iVar2;
        }
      }
    }
    this->m_theTimeState = 0;
  }
  return;
}

Assistant:

void MidiFile::makeDeltaTicks(void) {
	if (getTickState() == TIME_STATE_DELTA) {
		return;
	}
	int i, j;
	int temp;
	int length = getNumTracks();
	int *timedata = new int[length];
	for (i=0; i<length; i++) {
		timedata[i] = 0;
		if (m_events[i]->size() > 0) {
			timedata[i] = (*m_events[i])[0].tick;
		} else {
			continue;
		}
		for (j=1; j<(int)m_events[i]->size(); j++) {
			temp = (*m_events[i])[j].tick;
			int deltatick = temp - timedata[i];
			if (deltatick < 0) {
				std::cerr << "Error: negative delta tick value: " << deltatick << std::endl
				     << "Timestamps must be sorted first"
				     << " (use MidiFile::sortTracks() before writing)." << std::endl;
			}
			(*m_events[i])[j].tick = deltatick;
			timedata[i] = temp;
		}
	}
	m_theTimeState = TIME_STATE_DELTA;
	delete [] timedata;
}